

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t HUF_decompress1X2_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int flags)

{
  long lVar1;
  long lVar2;
  char cVar3;
  byte bVar4;
  uint uVar5;
  long lVar6;
  undefined2 *puVar7;
  uint uVar8;
  HUF_DTable HVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  undefined2 *puVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  bool bVar18;
  undefined2 *local_38;
  
  if ((flags & 1U) != 0) {
    if (cSrcSize == 0) {
      return 0xffffffffffffffb8;
    }
    puVar7 = (undefined2 *)dst;
    if (cSrcSize < 8) {
      uVar17 = (ulong)*cSrc;
      switch(cSrcSize) {
      case 7:
        uVar17 = uVar17 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
      case 6:
        uVar17 = uVar17 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
      case 5:
        uVar17 = uVar17 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
      case 4:
        uVar17 = uVar17 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
      case 3:
        uVar17 = uVar17 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
      case 2:
        uVar17 = uVar17 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
      }
      bVar4 = *(byte *)((long)cSrc + (cSrcSize - 1));
      if (bVar4 == 0) {
        return 0xffffffffffffffec;
      }
      uVar13 = (ulong)(LZCOUNT((uint)bVar4) + (int)cSrcSize * -8 + 0x29);
      uVar8 = *DTable;
      uVar5 = uVar8 >> 0x10;
      lVar6 = 0;
      if (dstSize < 8) goto LAB_001bbaf6;
    }
    else {
      bVar4 = *(byte *)((long)cSrc + (cSrcSize - 1));
      if (bVar4 == 0) {
        return 0xffffffffffffffff;
      }
      if (0xffffffffffffff88 < cSrcSize) {
        return cSrcSize;
      }
      lVar6 = cSrcSize - 8;
      uVar17 = *(ulong *)((long)cSrc + (cSrcSize - 8));
      uVar15 = (LZCOUNT((uint)bVar4) ^ 0xffffffe0U) + 9;
      uVar13 = (ulong)uVar15;
      uVar8 = *DTable;
      uVar5 = uVar8 >> 0x10;
      if (dstSize < 8) {
        if ((long)cSrcSize < 0x10) {
          if (lVar6 == 0) {
LAB_001bbadf:
            lVar6 = 0;
            goto LAB_001bbaf6;
          }
          uVar8 = (uint)lVar6;
          if (cSrc <= (void *)((long)cSrc + (lVar6 - (ulong)(uVar15 >> 3)))) {
            uVar8 = uVar15 >> 3;
          }
          uVar15 = uVar15 + uVar8 * -8;
        }
        else {
          uVar8 = uVar15 >> 3;
          uVar15 = uVar15 & 7;
        }
        uVar13 = (ulong)uVar15;
        lVar6 = lVar6 - (ulong)uVar8;
        uVar17 = *(ulong *)((long)cSrc + lVar6);
        goto LAB_001bbaf6;
      }
    }
    uVar15 = -uVar5 & 0x3f;
    if ((uVar8 & 0xfc0000) < 0xc0000) {
      do {
        if (lVar6 < 8) {
          if (lVar6 == 0) goto LAB_001bbadf;
          uVar8 = (uint)(uVar13 >> 3);
          bVar18 = cSrc <= (void *)((long)cSrc + (lVar6 - (uVar13 >> 3)));
          if (!bVar18) {
            uVar8 = (uint)lVar6;
          }
          uVar16 = (uint)uVar13 + uVar8 * -8;
        }
        else {
          uVar8 = (uint)(uVar13 >> 3);
          uVar16 = (uint)uVar13 & 7;
          bVar18 = true;
        }
        uVar13 = (ulong)uVar16;
        lVar6 = lVar6 - (ulong)uVar8;
        uVar17 = *(ulong *)((long)cSrc + lVar6);
        if (((undefined2 *)((long)dst + (dstSize - 9)) <= puVar7) || (!bVar18)) break;
        uVar13 = (uVar17 << (uVar13 & 0x3f)) >> uVar15;
        *puVar7 = (short)DTable[uVar13 + 1];
        uVar16 = *(byte *)((long)DTable + uVar13 * 4 + 6) + uVar16;
        uVar12 = (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7);
        uVar13 = (uVar17 << ((ulong)uVar16 & 0x3f)) >> uVar15;
        *(short *)((long)puVar7 + uVar12) = (short)DTable[uVar13 + 1];
        uVar16 = *(byte *)((long)DTable + uVar13 * 4 + 6) + uVar16;
        uVar13 = (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7);
        lVar1 = uVar13 + uVar12;
        uVar11 = (uVar17 << ((ulong)uVar16 & 0x3f)) >> uVar15;
        *(short *)((long)puVar7 + uVar13 + uVar12) = (short)DTable[uVar11 + 1];
        uVar16 = *(byte *)((long)DTable + uVar11 * 4 + 6) + uVar16;
        uVar13 = (ulong)*(byte *)((long)DTable + uVar11 * 4 + 7);
        lVar2 = uVar13 + lVar1;
        uVar11 = (uVar17 << ((ulong)uVar16 & 0x3f)) >> uVar15;
        *(short *)((long)puVar7 + uVar13 + lVar1) = (short)DTable[uVar11 + 1];
        uVar16 = *(byte *)((long)DTable + uVar11 * 4 + 6) + uVar16;
        uVar12 = (ulong)*(byte *)((long)DTable + uVar11 * 4 + 7);
        uVar11 = (uVar17 << ((ulong)uVar16 & 0x3f)) >> uVar15;
        *(short *)((long)puVar7 + uVar12 + lVar2) = (short)DTable[uVar11 + 1];
        uVar16 = *(byte *)((long)DTable + uVar11 * 4 + 6) + uVar16;
        uVar13 = (ulong)uVar16;
        puVar7 = (undefined2 *)
                 ((long)puVar7 + (ulong)*(byte *)((long)DTable + uVar11 * 4 + 7) + uVar12 + lVar2);
      } while (uVar16 < 0x41);
    }
    else {
      do {
        if (lVar6 < 8) {
          if (lVar6 == 0) goto LAB_001bbadf;
          uVar8 = (uint)(uVar13 >> 3);
          bVar18 = cSrc <= (void *)((long)cSrc + (lVar6 - (uVar13 >> 3)));
          if (!bVar18) {
            uVar8 = (uint)lVar6;
          }
          uVar16 = (uint)uVar13 + uVar8 * -8;
        }
        else {
          uVar8 = (uint)(uVar13 >> 3);
          uVar16 = (uint)uVar13 & 7;
          bVar18 = true;
        }
        uVar13 = (ulong)uVar16;
        lVar6 = lVar6 - (ulong)uVar8;
        uVar17 = *(ulong *)((long)cSrc + lVar6);
        if (((undefined2 *)((long)dst + (dstSize - 7)) <= puVar7) || (!bVar18)) break;
        uVar13 = (uVar17 << (uVar13 & 0x3f)) >> uVar15;
        *puVar7 = (short)DTable[uVar13 + 1];
        uVar16 = *(byte *)((long)DTable + uVar13 * 4 + 6) + uVar16;
        uVar13 = (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7);
        uVar11 = (uVar17 << ((ulong)uVar16 & 0x3f)) >> uVar15;
        *(short *)((long)puVar7 + uVar13) = (short)DTable[uVar11 + 1];
        uVar16 = *(byte *)((long)DTable + uVar11 * 4 + 6) + uVar16;
        uVar11 = (ulong)*(byte *)((long)DTable + uVar11 * 4 + 7);
        lVar1 = uVar11 + uVar13;
        uVar12 = (uVar17 << ((ulong)uVar16 & 0x3f)) >> uVar15;
        *(short *)((long)puVar7 + uVar11 + uVar13) = (short)DTable[uVar12 + 1];
        uVar16 = *(byte *)((long)DTable + uVar12 * 4 + 6) + uVar16;
        uVar12 = (ulong)*(byte *)((long)DTable + uVar12 * 4 + 7);
        uVar11 = (uVar17 << ((ulong)uVar16 & 0x3f)) >> uVar15;
        *(short *)((long)puVar7 + uVar12 + lVar1) = (short)DTable[uVar11 + 1];
        uVar16 = *(byte *)((long)DTable + uVar11 * 4 + 6) + uVar16;
        uVar13 = (ulong)uVar16;
        puVar7 = (undefined2 *)
                 ((long)puVar7 + (ulong)*(byte *)((long)DTable + uVar11 * 4 + 7) + uVar12 + lVar1);
      } while (uVar16 < 0x41);
    }
LAB_001bbaf6:
    local_38 = (undefined2 *)((long)dst + dstSize);
    if (1 < (ulong)((long)local_38 - (long)puVar7)) {
      for (; uVar8 = (uint)uVar13, uVar8 < 0x41;
          uVar13 = (ulong)(*(byte *)((long)DTable + uVar13 * 4 + 6) + uVar8)) {
        if (lVar6 < 8) {
          if (lVar6 == 0) {
            lVar6 = 0;
            break;
          }
          uVar15 = (uint)(uVar13 >> 3);
          bVar18 = cSrc <= (void *)((long)cSrc + (lVar6 - (uVar13 >> 3)));
          if (!bVar18) {
            uVar15 = (uint)lVar6;
          }
          uVar8 = uVar8 + uVar15 * -8;
        }
        else {
          uVar15 = (uint)(uVar13 >> 3);
          uVar8 = uVar8 & 7;
          bVar18 = true;
        }
        uVar13 = (ulong)uVar8;
        lVar6 = lVar6 - (ulong)uVar15;
        uVar17 = *(ulong *)((long)cSrc + lVar6);
        if ((local_38 + -1 < puVar7) || (!bVar18)) break;
        uVar13 = (uVar17 << (uVar13 & 0x3f)) >> (-uVar5 & 0x3f);
        *puVar7 = (short)DTable[uVar13 + 1];
        puVar7 = (undefined2 *)((long)puVar7 + (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7));
      }
      for (; puVar7 <= local_38 + -1;
          puVar7 = (undefined2 *)((ulong)*(byte *)((long)DTable + uVar11 * 4 + 7) + (long)puVar7)) {
        uVar11 = (uVar17 << (uVar13 & 0x3f)) >> (-uVar5 & 0x3f);
        *puVar7 = (short)DTable[uVar11 + 1];
        uVar13 = (ulong)((uint)*(byte *)((long)DTable + uVar11 * 4 + 6) + (int)uVar13);
      }
    }
    uVar8 = (uint)uVar13;
    if (puVar7 < local_38) {
      uVar17 = (uVar17 << (uVar13 & 0x3f)) >> ((ulong)(byte)-(char)uVar5 & 0x3f);
      *(char *)puVar7 = (char)DTable[uVar17 + 1];
      if (*(char *)((long)DTable + uVar17 * 4 + 7) == '\x01') {
        uVar8 = uVar8 + *(byte *)((long)DTable + uVar17 * 4 + 6);
      }
      else if (uVar8 < 0x40) {
        uVar5 = uVar8 + *(byte *)((long)DTable + uVar17 * 4 + 6);
        uVar8 = 0x40;
        if (uVar5 < 0x40) {
          uVar8 = uVar5;
        }
      }
    }
    if (uVar8 != 0x40) {
      dstSize = 0xffffffffffffffec;
    }
    if (lVar6 != 0) {
      dstSize = 0xffffffffffffffec;
    }
    return dstSize;
  }
  if (cSrcSize == 0) {
    return 0xffffffffffffffb8;
  }
  puVar7 = (undefined2 *)dst;
  if (cSrcSize < 8) {
    uVar17 = (ulong)*cSrc;
    switch(cSrcSize) {
    case 7:
      uVar17 = uVar17 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
    case 6:
      uVar17 = uVar17 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
    case 5:
      uVar17 = uVar17 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
    case 4:
      uVar17 = uVar17 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
    case 3:
      uVar17 = uVar17 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
    case 2:
      uVar17 = uVar17 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
    }
    bVar4 = *(byte *)((long)cSrc + (cSrcSize - 1));
    if (bVar4 == 0) {
      return 0xffffffffffffffec;
    }
    uVar8 = 0x1f;
    if (bVar4 != 0) {
      for (; bVar4 >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    uVar8 = (uVar8 ^ 0x1f) + (int)cSrcSize * -8 + 0x29;
    HVar9 = *DTable;
    cVar3 = (char)(HVar9 >> 0x10);
    lVar6 = 0;
    if (dstSize < 8) goto LAB_0017765f;
  }
  else {
    bVar4 = *(byte *)((long)cSrc + (cSrcSize - 1));
    if (bVar4 == 0) {
      return 0xffffffffffffffff;
    }
    if (0xffffffffffffff88 < cSrcSize) {
      return cSrcSize;
    }
    lVar6 = cSrcSize - 8;
    uVar17 = *(ulong *)((long)cSrc + (cSrcSize - 8));
    uVar8 = 0x1f;
    if (bVar4 != 0) {
      for (; bVar4 >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    uVar8 = ~uVar8 + 9;
    HVar9 = *DTable;
    cVar3 = (char)(HVar9 >> 0x10);
    if (dstSize < 8) {
      if ((long)cSrcSize < 0x10) {
        if (lVar6 == 0) {
          lVar6 = 0;
          goto LAB_0017765f;
        }
        uVar5 = (uint)lVar6;
        if (cSrc <= (void *)((long)cSrc + ((cSrcSize - 8) - (ulong)(uVar8 >> 3)))) {
          uVar5 = uVar8 >> 3;
        }
        uVar8 = uVar8 + uVar5 * -8;
      }
      else {
        uVar5 = uVar8 >> 3;
        uVar8 = uVar8 & 7;
      }
      lVar6 = lVar6 - (ulong)uVar5;
      uVar17 = *(ulong *)((long)cSrc + lVar6);
      goto LAB_0017765f;
    }
  }
  cVar3 = (char)(HVar9 >> 0x10);
  bVar4 = -cVar3 & 0x3f;
  if ((HVar9 & 0xfc0000) < 0xc0000) {
    do {
      if (lVar6 < 8) {
        if (lVar6 == 0) goto LAB_00177643;
        uVar5 = uVar8 >> 3;
        bVar18 = cSrc <= (void *)((long)cSrc + (lVar6 - (ulong)uVar5));
        if (!bVar18) {
          uVar5 = (uint)lVar6;
        }
        uVar8 = uVar8 + uVar5 * -8;
      }
      else {
        uVar5 = uVar8 >> 3;
        uVar8 = uVar8 & 7;
        bVar18 = true;
      }
      lVar6 = lVar6 - (ulong)uVar5;
      uVar17 = *(ulong *)((long)cSrc + lVar6);
      if (((undefined2 *)((long)dst + (dstSize - 9)) <= puVar7) || (!bVar18)) break;
      uVar13 = (uVar17 << ((byte)uVar8 & 0x3f)) >> bVar4;
      *puVar7 = (short)DTable[uVar13 + 1];
      iVar10 = *(byte *)((long)DTable + uVar13 * 4 + 6) + uVar8;
      uVar13 = (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7);
      uVar11 = (uVar17 << ((byte)iVar10 & 0x3f)) >> bVar4;
      *(short *)((long)puVar7 + uVar13) = (short)DTable[uVar11 + 1];
      iVar10 = (uint)*(byte *)((long)DTable + uVar11 * 4 + 6) + iVar10;
      uVar11 = (ulong)*(byte *)((long)DTable + uVar11 * 4 + 7);
      lVar1 = uVar11 + uVar13;
      uVar12 = (uVar17 << ((byte)iVar10 & 0x3f)) >> bVar4;
      *(short *)((long)puVar7 + uVar11 + uVar13) = (short)DTable[uVar12 + 1];
      iVar10 = (uint)*(byte *)((long)DTable + uVar12 * 4 + 6) + iVar10;
      uVar11 = (uVar17 << ((byte)iVar10 & 0x3f)) >> bVar4;
      uVar13 = (ulong)*(byte *)((long)DTable + uVar12 * 4 + 7);
      lVar2 = uVar13 + lVar1;
      *(short *)((long)puVar7 + uVar13 + lVar1) = (short)DTable[uVar11 + 1];
      iVar10 = (uint)*(byte *)((long)DTable + uVar11 * 4 + 6) + iVar10;
      uVar13 = (ulong)*(byte *)((long)DTable + uVar11 * 4 + 7);
      uVar11 = (uVar17 << ((byte)iVar10 & 0x3f)) >> bVar4;
      *(short *)((long)puVar7 + uVar13 + lVar2) = (short)DTable[uVar11 + 1];
      uVar8 = (uint)*(byte *)((long)DTable + uVar11 * 4 + 6) + iVar10;
      puVar7 = (undefined2 *)
               ((long)puVar7 + (ulong)*(byte *)((long)DTable + uVar11 * 4 + 7) + uVar13 + lVar2);
    } while (uVar8 < 0x41);
  }
  else {
    do {
      if (lVar6 < 8) {
        if (lVar6 == 0) goto LAB_00177643;
        uVar5 = uVar8 >> 3;
        bVar18 = cSrc <= (void *)((long)cSrc + (lVar6 - (ulong)uVar5));
        if (!bVar18) {
          uVar5 = (uint)lVar6;
        }
        uVar8 = uVar8 + uVar5 * -8;
      }
      else {
        uVar5 = uVar8 >> 3;
        uVar8 = uVar8 & 7;
        bVar18 = true;
      }
      lVar6 = lVar6 - (ulong)uVar5;
      uVar17 = *(ulong *)((long)cSrc + lVar6);
      if (((undefined2 *)((long)dst + (dstSize - 7)) <= puVar7) || (!bVar18)) break;
      uVar13 = (uVar17 << ((byte)uVar8 & 0x3f)) >> bVar4;
      *puVar7 = (short)DTable[uVar13 + 1];
      iVar10 = *(byte *)((long)DTable + uVar13 * 4 + 6) + uVar8;
      uVar11 = (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7);
      uVar13 = (uVar17 << ((byte)iVar10 & 0x3f)) >> bVar4;
      *(short *)((long)puVar7 + uVar11) = (short)DTable[uVar13 + 1];
      iVar10 = (uint)*(byte *)((long)DTable + uVar13 * 4 + 6) + iVar10;
      uVar12 = (uVar17 << ((byte)iVar10 & 0x3f)) >> bVar4;
      uVar13 = (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7);
      lVar1 = uVar13 + uVar11;
      *(short *)((long)puVar7 + uVar13 + uVar11) = (short)DTable[uVar12 + 1];
      iVar10 = (uint)*(byte *)((long)DTable + uVar12 * 4 + 6) + iVar10;
      uVar13 = (ulong)*(byte *)((long)DTable + uVar12 * 4 + 7);
      uVar11 = (uVar17 << ((byte)iVar10 & 0x3f)) >> bVar4;
      *(short *)((long)puVar7 + uVar13 + lVar1) = (short)DTable[uVar11 + 1];
      uVar8 = (uint)*(byte *)((long)DTable + uVar11 * 4 + 6) + iVar10;
      puVar7 = (undefined2 *)
               ((long)puVar7 + (ulong)*(byte *)((long)DTable + uVar11 * 4 + 7) + uVar13 + lVar1);
    } while (uVar8 < 0x41);
  }
LAB_0017765f:
  puVar14 = (undefined2 *)((long)dst + dstSize);
  if (1 < (ulong)((long)puVar14 - (long)puVar7)) {
    for (; uVar8 < 0x41; uVar8 = *(byte *)((long)DTable + uVar13 * 4 + 6) + uVar8) {
      if (lVar6 < 8) {
        if (lVar6 == 0) {
          lVar6 = 0;
          break;
        }
        uVar5 = uVar8 >> 3;
        bVar18 = cSrc <= (void *)((long)cSrc + (lVar6 - (ulong)uVar5));
        if (!bVar18) {
          uVar5 = (uint)lVar6;
        }
        uVar8 = uVar8 + uVar5 * -8;
      }
      else {
        uVar5 = uVar8 >> 3;
        uVar8 = uVar8 & 7;
        bVar18 = true;
      }
      lVar6 = lVar6 - (ulong)uVar5;
      uVar17 = *(ulong *)((long)cSrc + lVar6);
      if ((puVar14 + -1 < puVar7) || (!bVar18)) break;
      uVar13 = (uVar17 << ((byte)uVar8 & 0x3f)) >> (-cVar3 & 0x3fU);
      *puVar7 = (short)DTable[uVar13 + 1];
      puVar7 = (undefined2 *)((long)puVar7 + (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7));
    }
    for (; puVar7 <= puVar14 + -1;
        puVar7 = (undefined2 *)((ulong)*(byte *)((long)DTable + uVar13 * 4 + 7) + (long)puVar7)) {
      uVar13 = (uVar17 << ((byte)uVar8 & 0x3f)) >> (-cVar3 & 0x3fU);
      *puVar7 = (short)DTable[uVar13 + 1];
      uVar8 = *(byte *)((long)DTable + uVar13 * 4 + 6) + uVar8;
    }
  }
  if (puVar7 < puVar14) {
    uVar17 = (uVar17 << ((byte)uVar8 & 0x3f)) >> (-cVar3 & 0x3fU);
    *(char *)puVar7 = (char)DTable[uVar17 + 1];
    if (*(char *)((long)DTable + uVar17 * 4 + 7) == '\x01') {
      uVar8 = uVar8 + *(byte *)((long)DTable + uVar17 * 4 + 6);
    }
    else if ((uVar8 < 0x40) &&
            (uVar8 = uVar8 + *(byte *)((long)DTable + uVar17 * 4 + 6), 0x3f < uVar8)) {
      uVar8 = 0x40;
    }
  }
  if (uVar8 != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (lVar6 != 0) {
    dstSize = 0xffffffffffffffec;
  }
  return dstSize;
LAB_00177643:
  lVar6 = 0;
  goto LAB_0017765f;
}

Assistant:

HUF_DGEN(HUF_decompress1X2_usingDTable_internal)

size_t HUF_decompress1X2_DCtx_wksp(HUF_DTable* DCtx, void* dst, size_t dstSize,
                                   const void* cSrc, size_t cSrcSize,
                                   void* workSpace, size_t wkspSize, int flags)
{
    const BYTE* ip = (const BYTE*) cSrc;

    size_t const hSize = HUF_readDTableX2_wksp(DCtx, cSrc, cSrcSize,
                                               workSpace, wkspSize, flags);
    if (HUF_isError(hSize)) return hSize;
    if (hSize >= cSrcSize) return ERROR(srcSize_wrong);
    ip += hSize; cSrcSize -= hSize;

    return HUF_decompress1X2_usingDTable_internal(dst, dstSize, ip, cSrcSize, DCtx, flags);
}